

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModelValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)555>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar2;
  CustomModel *pCVar3;
  long *plVar4;
  Node *pNVar5;
  undefined1 auVar6 [8];
  _Alloc_hider _Var7;
  ModelDescription *interface;
  Result result;
  undefined1 local_a8 [8];
  _Alloc_hider _Stack_a0;
  undefined1 local_98 [8];
  undefined1 auStack_90 [16];
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  undefined1 local_70 [8];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [32];
  value_type *local_28;
  
  if (format->_oneof_case_[0] != 0x22b) {
    local_80 = (undefined1  [8])local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"Model not an a CustomModel.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_80);
    auVar6 = local_70;
    _Var7._M_p = (pointer)local_80;
    if (local_80 == (undefined1  [8])local_70) {
      return __return_storage_ptr__;
    }
    goto LAB_00269ae0;
  }
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)local_80);
  validateModelDescription((Result *)local_a8,interface,format->specificationversion_);
  local_80 = local_a8;
  std::__cxx11::string::operator=((string *)&local_78,(string *)&_Stack_a0);
  if ((InnerMap *)_Stack_a0._M_p != (InnerMap *)auStack_90) {
    operator_delete(_Stack_a0._M_p,auStack_90._0_8_ + 1);
  }
  bVar2 = Result::good((Result *)local_80);
  if (bVar2) {
    if (format->_oneof_case_[0] == 0x22b) {
      pCVar3 = (CustomModel *)(format->Type_).pipeline_;
    }
    else {
      pCVar3 = Specification::CustomModel::default_instance();
    }
    if (((pCVar3->classname_).ptr_)->_M_string_length != 0) {
      _Stack_a0._M_p = (pointer)(pCVar3->parameters_).map_.elements_;
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
      ::InnerMap::
      iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
      ::SearchFrom((iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
                    *)local_a8,((InnerMap *)_Stack_a0._M_p)->index_of_first_non_null_);
      local_48._16_4_ = local_a8._0_4_;
      local_48._20_4_ = local_a8._4_4_;
      local_48._24_4_ = _Stack_a0._M_p._0_4_;
      local_48._28_4_ = _Stack_a0._M_p._4_4_;
      local_28 = (value_type *)local_98;
      while (CONCAT44(local_48._20_4_,local_48._16_4_) != 0) {
        __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (CONCAT44(local_48._20_4_,local_48._16_4_) + 0x20);
        if (__rhs->_M_string_length == 0) {
          local_a8 = (undefined1  [8])local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a8,"CustomModel.parameters must have non-empty string keys.",""
                    );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          goto LAB_00269a0f;
        }
        if (*(int *)((long)&__rhs[1].field_2 + 0xc) == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_58,"CustomModel.parameters[\'",__rhs);
          plVar4 = (long *)std::__cxx11::string::append(local_58._M_local_buf);
          pNVar5 = (Node *)(plVar4 + 2);
          if ((Node *)*plVar4 == pNVar5) {
            local_98 = (undefined1  [8])(pNVar5->kv).k_._M_dataplus._M_p;
            auStack_90._0_8_ = plVar4[3];
            local_a8 = (undefined1  [8])local_98;
          }
          else {
            local_98 = (undefined1  [8])(pNVar5->kv).k_._M_dataplus._M_p;
            local_a8 = (undefined1  [8])*plVar4;
          }
          _Stack_a0._M_p = (pointer)plVar4[1];
          *plVar4 = (long)pNVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          if (local_a8 != (undefined1  [8])local_98) {
            operator_delete((void *)local_a8,(ulong)((long)local_98 + 1));
          }
          if ((Node *)local_58._0_8_ == (Node *)local_48) goto LAB_00269acd;
          goto LAB_00269ac5;
        }
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        ::InnerMap::
        iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
        ::operator++((iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
                      *)(local_48 + 0x10));
      }
      goto LAB_0026995c;
    }
    local_a8 = (undefined1  [8])local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"CustomModel must have non-empty className.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
LAB_00269a0f:
    local_48._0_8_ = local_98;
    local_58._M_allocated_capacity = (size_type)local_a8;
    if (local_a8 != (undefined1  [8])local_98) {
LAB_00269ac5:
      operator_delete((void *)local_58._M_allocated_capacity,
                      (ulong)((long)&(((Node *)local_48._0_8_)->kv).k_._M_dataplus._M_p + 1));
    }
  }
  else {
LAB_0026995c:
    __return_storage_ptr__->m_type = local_80._0_4_;
    __return_storage_ptr__->m_reason = local_80._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((Node *)local_78._M_p == (Node *)(local_70 + 8)) {
      paVar1->_M_allocated_capacity = CONCAT71(local_68._1_7_,local_68[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_68._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_78._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_68._1_7_,local_68[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = (size_type)local_70;
    local_70 = (undefined1  [8])0x0;
    local_68[0] = '\0';
    local_78._M_p = (pointer)(local_70 + 8);
  }
LAB_00269acd:
  if ((Node *)local_78._M_p == (Node *)(local_70 + 8)) {
    return __return_storage_ptr__;
  }
  auVar6 = (undefined1  [8])CONCAT71(local_68._1_7_,local_68[0]);
  _Var7._M_p = local_78._M_p;
LAB_00269ae0:
  operator_delete(_Var7._M_p,(long)auVar6 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_customModel>(const Specification::Model& format) {
        const auto& interface = format.description();

        // Make sure that if there is a double output type, there is exactly one output index selected.
        if(!format.has_custommodel()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an a CustomModel.");
        }
        
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        const auto& customModel = format.custommodel();

        if (customModel.classname().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "CustomModel must have non-empty className.");
        }

        const auto& parameters = customModel.parameters();
        for(const auto& param : parameters) {
            if (param.first.empty()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "CustomModel.parameters must have non-empty string keys.");
            }

            switch (param.second.value_case()) {
                case Specification::CustomModel_CustomModelParamValue::VALUE_NOT_SET:
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "CustomModel.parameters['"+param.first+"'] does not have a set value");
                default:
                    break;
            }
        }

        return result;
    }